

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall
p2t::SweepContext::SweepContext
          (SweepContext *this,vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline)

{
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline_local;
  SweepContext *this_local;
  
  std::vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::vector(&this->edge_list);
  Basin::Basin(&this->basin);
  EdgeEvent::EdgeEvent(&this->edge_event);
  std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::vector(&this->triangles_);
  std::__cxx11::list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::list(&this->map_);
  std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::vector(&this->points_,polyline);
  this->front_ = (AdvancingFront *)0x0;
  this->head_ = (Point *)0x0;
  this->tail_ = (Point *)0x0;
  this->af_head_ = (Node *)0x0;
  this->af_middle_ = (Node *)0x0;
  this->af_tail_ = (Node *)0x0;
  InitEdges(this,&this->points_);
  return;
}

Assistant:

SweepContext::SweepContext(const std::vector<Point*>& polyline) : points_(polyline),
  front_(0),
  head_(0),
  tail_(0),
  af_head_(0),
  af_middle_(0),
  af_tail_(0)
{
  InitEdges(points_);
}